

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_unary_expression_tree(FILE *out,AST_Unary_Expression *unary_expression)

{
  print_ast_enum(out,unary_expression->type);
  if (unary_expression->type == OP_CAST) {
    fputc(0x28,(FILE *)out);
    print_type(out,unary_expression->value_type,'\x01');
    fputc(0x29,(FILE *)out);
  }
  print_ast(out,unary_expression->operand);
  return;
}

Assistant:

void print_unary_expression_tree(FILE *out,struct AST_Unary_Expression *unary_expression)
{
	print_ast_enum(out,unary_expression->type);
	if(unary_expression->type==OP_CAST)
	{
		fprintf(out,"(");
		print_type(out,unary_expression->value_type,1);
		fprintf(out,")");
	}
	print_ast(out,unary_expression->operand);
}